

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcFaceOuterBound::~IfcFaceOuterBound(IfcFaceOuterBound *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcFaceBound.super_IfcTopologicalRepresentationItem.field_0x28 =
       0x935368;
  *(undefined8 *)
   &(this->super_IfcFaceBound).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x9353e0;
  this[-1].super_IfcFaceBound.Orientation._M_dataplus._M_p = (pointer)0x935390;
  this[-1].super_IfcFaceBound.Orientation.field_2._M_allocated_capacity = 0x9353b8;
  puVar1 = *(undefined1 **)&this[-1].super_IfcFaceBound.field_0x60;
  if (puVar1 != &this[-1].field_0x70) {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].super_IfcFaceBound.super_IfcTopologicalRepresentationItem.field_0x28);
  return;
}

Assistant:

IfcFaceOuterBound() : Object("IfcFaceOuterBound") {}